

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extendable_data_dictionary.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
          (ExtendableDataDictionary *this,FieldDef *field_def)

{
  pointer pcVar1;
  bool bVar2;
  invalid_argument *this_00;
  optional<bidfx_public_api::price::pixie::FieldDef> previous;
  FieldDef local_b0;
  char local_80;
  long *local_78 [2];
  long local_68 [2];
  FieldDef local_58;
  
  FieldDef::FieldDef(&local_58,field_def);
  bVar2 = DataDictionaryUtils::IsValid(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name_._M_dataplus._M_p != &local_58.name_.field_2) {
    operator_delete(local_58.name_._M_dataplus._M_p,local_58.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if (bVar2) {
    if ((this->field_defs_by_fid_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      (**(this->super_IDataDictionary)._vptr_IDataDictionary)
                (&local_b0,this,(ulong)(uint)field_def->fid_);
      if (local_80 == '\x01') {
        HandleDuplicatedFid(this,&local_b0);
      }
      if (local_80 == '\x01') {
        local_80 = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.name_._M_dataplus._M_p != &local_b0.name_.field_2) {
          operator_delete(local_b0.name_._M_dataplus._M_p,
                          local_b0.name_.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::
    _Rb_tree<int,std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>,std::_Select1st<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>,std::less<int>,std::allocator<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>>
    ::_M_emplace_unique<int&,bidfx_public_api::price::pixie::FieldDef&>
              ((_Rb_tree<int,std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>,std::_Select1st<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>,std::less<int>,std::allocator<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>>
                *)&this->field_defs_by_fid_,&field_def->fid_,field_def);
    if ((this->field_def_by_name_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      pcVar1 = (field_def->name_)._M_dataplus._M_p;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar1,pcVar1 + (field_def->name_)._M_string_length);
      (*(this->super_IDataDictionary)._vptr_IDataDictionary[1])(&local_b0,this,(string *)local_78);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if (local_80 == '\x01') {
        HandleDuplicatedName(this,&local_b0);
      }
      if (local_80 == '\x01') {
        local_80 = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.name_._M_dataplus._M_p != &local_b0.name_.field_2) {
          operator_delete(local_b0.name_._M_dataplus._M_p,
                          local_b0.name_.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>>
    ::_M_emplace_unique<std::__cxx11::string&,bidfx_public_api::price::pixie::FieldDef&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>>
                *)&this->field_def_by_name_,&field_def->name_,field_def);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid field def added to dictionary");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ExtendableDataDictionary::AddFieldDef(FieldDef field_def)
{
    if (!DataDictionaryUtils::IsValid(field_def))
    {
        throw std::invalid_argument("invalid field def added to dictionary");
    }

    if (!field_defs_by_fid_.empty())
    {
        std::optional<FieldDef> previous = FieldDefByFid(field_def.fid_);
        if (previous)
        {
            HandleDuplicatedFid(*previous);
        }
    }
    field_defs_by_fid_.emplace(field_def.fid_, field_def);
    if (!field_def_by_name_.empty())
    {
        std::optional<FieldDef> previous = FieldDefByName(field_def.name_);
        if (previous)
        {
            HandleDuplicatedName(*previous);
        }
    }
    field_def_by_name_.emplace(field_def.name_, field_def);
}